

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxalloc.h
# Opt level: O2

void soplex::spx_realloc<soplex::DataKey*>(DataKey **p,int n)

{
  DataKey *pDVar1;
  ostream *poVar2;
  SPxMemoryException *this;
  allocator local_39;
  string local_38;
  
  pDVar1 = (DataKey *)realloc(*p,(ulong)(n + (uint)(n == 0)) << 3);
  if (pDVar1 != (DataKey *)0x0) {
    *p = pDVar1;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "EMALLC02 realloc: Out of memory - cannot allocate ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  poVar2 = std::operator<<(poVar2," bytes");
  std::endl<char,std::char_traits<char>>(poVar2);
  this = (SPxMemoryException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_38,"XMALLC02 realloc: Could not allocate enough memory",&local_39);
  SPxMemoryException::SPxMemoryException(this,&local_38);
  __cxa_throw(this,&SPxMemoryException::typeinfo,SPxException::~SPxException);
}

Assistant:

inline void spx_realloc(T& p, int n)
{
   assert(n >= 0);

   /* new pointer to not lose old one in case of problems */
   T pp;

   if(n == 0)
      n = 1;

   try
   {
      pp = reinterpret_cast<T>(realloc(p, sizeof(*p) * (unsigned int) n));
   }
   catch(const std::bad_alloc&)
   {
      throw(SPxMemoryException("Error reallocating memory"));
   }

   if(nullptr == pp)
   {
      std::cerr << "EMALLC02 realloc: Out of memory - cannot allocate "
                << sizeof(*p) * (unsigned int) n << " bytes" << std::endl;
      throw(SPxMemoryException("XMALLC02 realloc: Could not allocate enough memory"));
   }

   p = pp;
}